

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Net.cpp
# Opt level: O2

int __thiscall
CNet::GetWires3D(CNet *this,vector<CWire_*,_std::allocator<CWire_*>_> *pWires,CPoint *pPoint,
                int iMode,int iValue)

{
  pointer ppCVar1;
  uint uVar2;
  __normal_iterator<CWire_**,_std::vector<CWire_*,_std::allocator<CWire_*>_>_> _Var3;
  pointer ppCVar4;
  CWire *pWire;
  deque<CPoint_*,_std::allocator<CPoint_*>_> Queue;
  CWire *local_98;
  CPoint *local_90;
  CNet *local_88;
  _Deque_base<CPoint_*,_std::allocator<CPoint_*>_> local_80;
  
  if (pPoint == (CPoint *)0x0) {
    ppCVar1 = (this->m_Wire).super__Vector_base<CWire_*,_std::allocator<CWire_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    local_90 = (value_type)0x0;
    for (ppCVar4 = (this->m_Wire).super__Vector_base<CWire_*,_std::allocator<CWire_*>_>._M_impl.
                   super__Vector_impl_data._M_start; ppCVar4 != ppCVar1; ppCVar4 = ppCVar4 + 1) {
      local_80._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)*ppCVar4;
      _Var3 = std::
              __find_if<__gnu_cxx::__normal_iterator<CWire**,std::vector<CWire*,std::allocator<CWire*>>>,__gnu_cxx::__ops::_Iter_equals_val<CWire*const>>
                        ((pWires->super__Vector_base<CWire_*,_std::allocator<CWire_*>_>)._M_impl.
                         super__Vector_impl_data._M_start,
                         (pWires->super__Vector_base<CWire_*,_std::allocator<CWire_*>_>)._M_impl.
                         super__Vector_impl_data._M_finish,&local_80);
      if (_Var3._M_current !=
          (pWires->super__Vector_base<CWire_*,_std::allocator<CWire_*>_>)._M_impl.
          super__Vector_impl_data._M_finish) {
        __assert_fail("find(pWires->begin(),pWires->end(),pWire)==pWires->end()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Net.cpp"
                      ,900,"int CNet::GetWires3D(vector<CWire *> *, CPoint *, int, int)");
      }
      if (iMode == 1) {
        uVar2 = ((CObject *)local_80._M_impl.super__Deque_impl_data._M_map)->m_iState;
      }
      else {
        if (iMode != 0) {
          __assert_fail("FALSE",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Net.cpp"
                        ,0x38f,"int CNet::GetWires3D(vector<CWire *> *, CPoint *, int, int)");
        }
        uVar2 = ((CObject *)local_80._M_impl.super__Deque_impl_data._M_map)->m_iProp;
      }
      if ((uVar2 & iValue) != 0) {
        std::vector<CWire_*,_std::allocator<CWire_*>_>::push_back(pWires,(value_type *)&local_80);
      }
    }
  }
  else {
    local_90 = pPoint;
    local_88 = this;
    std::_Deque_base<CPoint_*,_std::allocator<CPoint_*>_>::_Deque_base(&local_80);
    std::deque<CPoint_*,_std::allocator<CPoint_*>_>::push_front
              ((deque<CPoint_*,_std::allocator<CPoint_*>_> *)&local_80,&local_90);
    while (local_80._M_impl.super__Deque_impl_data._M_finish._M_cur !=
           local_80._M_impl.super__Deque_impl_data._M_start._M_cur) {
      local_90 = *local_80._M_impl.super__Deque_impl_data._M_start._M_cur;
      std::deque<CPoint_*,_std::allocator<CPoint_*>_>::pop_front
                ((deque<CPoint_*,_std::allocator<CPoint_*>_> *)&local_80);
      ppCVar1 = (local_88->m_Wire).super__Vector_base<CWire_*,_std::allocator<CWire_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      for (ppCVar4 = (local_88->m_Wire).super__Vector_base<CWire_*,_std::allocator<CWire_*>_>.
                     _M_impl.super__Vector_impl_data._M_start; ppCVar4 != ppCVar1;
          ppCVar4 = ppCVar4 + 1) {
        local_98 = *ppCVar4;
        _Var3 = std::
                __find_if<__gnu_cxx::__normal_iterator<CWire**,std::vector<CWire*,std::allocator<CWire*>>>,__gnu_cxx::__ops::_Iter_equals_val<CWire*const>>
                          ((pWires->super__Vector_base<CWire_*,_std::allocator<CWire_*>_>)._M_impl.
                           super__Vector_impl_data._M_start,
                           (pWires->super__Vector_base<CWire_*,_std::allocator<CWire_*>_>)._M_impl.
                           super__Vector_impl_data._M_finish,&local_98);
        if (_Var3._M_current ==
            (pWires->super__Vector_base<CWire_*,_std::allocator<CWire_*>_>)._M_impl.
            super__Vector_impl_data._M_finish) {
          if (iMode == 1) {
            uVar2 = (local_98->super_CObject).m_iState;
          }
          else {
            if (iMode != 0) {
              __assert_fail("FALSE",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Net.cpp"
                            ,0x3ac,"int CNet::GetWires3D(vector<CWire *> *, CPoint *, int, int)");
            }
            uVar2 = (local_98->super_CObject).m_iProp;
          }
          if ((uVar2 & iValue) != 0) {
            uVar2 = CWire::IsOn3D(local_98,local_90);
            if ((uVar2 & 3) != 0) {
              std::vector<CWire_*,_std::allocator<CWire_*>_>::push_back(pWires,&local_98);
            }
            if ((uVar2 & 2) != 0) {
              std::deque<CPoint_*,_std::allocator<CPoint_*>_>::push_front
                        ((deque<CPoint_*,_std::allocator<CPoint_*>_> *)&local_80,
                         &local_98->m_pPointS);
            }
            if ((uVar2 & 1) != 0) {
              std::deque<CPoint_*,_std::allocator<CPoint_*>_>::push_front
                        ((deque<CPoint_*,_std::allocator<CPoint_*>_> *)&local_80,
                         &local_98->m_pPointE);
            }
          }
        }
      }
    }
    std::_Deque_base<CPoint_*,_std::allocator<CPoint_*>_>::~_Deque_base(&local_80);
  }
  return (int)((ulong)((long)(pWires->super__Vector_base<CWire_*,_std::allocator<CWire_*>_>)._M_impl
                             .super__Vector_impl_data._M_finish -
                      (long)(pWires->super__Vector_base<CWire_*,_std::allocator<CWire_*>_>)._M_impl.
                            super__Vector_impl_data._M_start) >> 3);
}

Assistant:

int CNet::GetWires3D(vector<CWire*>* pWires, CPoint* pPoint, int iMode, int iValue)
{
	if(!pPoint)
	{
		for(vector<CWire*>::iterator itr=m_Wire.begin(),end=m_Wire.end();itr!=end;++itr)
		{
			CWire*	pWire	=	*itr;
			assert(find(pWires->begin(),pWires->end(),pWire)==pWires->end());

			int	iRet	=	RET_WIRE_NONE;
			switch(iMode) {
			case GET_MODE_PROP:
				if(pWire->GetProp()&iValue)		pWires->push_back(pWire);
				break;
			case GET_MODE_STATE:
				if(pWire->GetState()&iValue)	pWires->push_back(pWire);
				break;
			default:
				assert(FALSE);
				break;
			}
		}
	}
	else
	{
		deque<CPoint*> Queue;
		
		Queue.push_front(pPoint);
		
		while(!Queue.empty())
		{
			pPoint	=	Queue.front();Queue.pop_front();
			for(vector<CWire*>::iterator itr=m_Wire.begin(),end=m_Wire.end();itr!=end;++itr)
			{
				CWire*	pWire	=	*itr;

				if(find(pWires->begin(),pWires->end(),pWire)!=pWires->end())	continue;
				
				int	iRet	=	RET_WIRE_NONE;
				switch(iMode) {
				case GET_MODE_PROP:
					if(pWire->GetProp()&iValue)		iRet	=	pWire->IsOn3D(pPoint);
					break;
				case GET_MODE_STATE:
					if(pWire->GetState()&iValue)	iRet	=	pWire->IsOn3D(pPoint);
					break;
				default:
					assert(FALSE);
					break;
				}
				
				if(iRet&RET_WIRE_SE)	pWires->push_back(pWire);
				if(iRet&RET_WIRE_E)		Queue.push_front(pWire->m_pPointS);				
				if(iRet&RET_WIRE_S)		Queue.push_front(pWire->m_pPointE);
			}
		}
	}
	return	pWires->size();
}